

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O0

WirehairResult wirehair_init_(int expected_version)

{
  int iVar1;
  int in_EDI;
  int gfInitResult;
  undefined4 local_4;
  
  if (in_EDI == 2) {
    iVar1 = gf256_init_(0x105373);
    if (iVar1 == 0) {
      m_init = true;
      local_4 = Wirehair_Success;
    }
    else {
      local_4 = Wirehair_UnsupportedPlatform;
    }
  }
  else {
    local_4 = Wirehair_InvalidInput;
  }
  return local_4;
}

Assistant:

WIREHAIR_EXPORT WirehairResult wirehair_init_(int expected_version)
{
    // If version does not match:
    if (expected_version != WIREHAIR_VERSION) {
        return Wirehair_InvalidInput;
    }

    const int gfInitResult = gf256_init();

    // If gf256 init failed:
    if (gfInitResult != 0) {
        return Wirehair_UnsupportedPlatform;
    }

    m_init = true;
    return Wirehair_Success;
}